

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_fd.c
# Opt level: O2

wchar_t file_open(archive_conflict *a,void *client_data)

{
  wchar_t wVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  wchar_t *pwVar5;
  char *fmt;
  char *mbs;
  wchar_t *wcs;
  stat st;
  
  mbs = (char *)0x0;
  wcs = (wchar_t *)0x0;
  wVar1 = archive_mstring_get_mbs(a,(archive_mstring *)((long)client_data + 8),&mbs);
  if (wVar1 == L'\0') {
    iVar2 = open(mbs,0x80241,0x1b6);
    *(int *)client_data = iVar2;
    __archive_ensure_cloexec_flag(iVar2);
    pwVar5 = (wchar_t *)mbs;
    if (*client_data < 0) {
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      if (pwVar5 != (wchar_t *)0x0) {
        fmt = "Failed to open \'%s\'";
        goto LAB_0025927b;
      }
      fmt = "Failed to open \'%ls\'";
    }
    else {
      iVar2 = fstat(*client_data,(stat *)&st);
      pwVar5 = (wchar_t *)mbs;
      if (iVar2 == 0) {
        iVar2 = archive_write_get_bytes_in_last_block((archive *)a);
        if (iVar2 < 0) {
          uVar3 = st.st_mode & 0xf000;
          iVar2 = 0;
          if ((((short)uVar3 != 0x1000) && (uVar3 != 0x2000)) && (uVar3 != 0x6000)) {
            iVar2 = 1;
          }
          archive_write_set_bytes_in_last_block((archive *)a,iVar2);
        }
        if ((st.st_mode & 0xf000) == 0x8000) {
          archive_write_set_skip_file((archive *)a,st.st_dev,st.st_ino);
          return L'\0';
        }
        return L'\0';
      }
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      if (pwVar5 != (wchar_t *)0x0) {
        fmt = "Couldn\'t stat \'%s\'";
        goto LAB_0025927b;
      }
      fmt = "Couldn\'t stat \'%ls\'";
    }
    pwVar5 = (wchar_t *)0x0;
  }
  else {
    piVar4 = __errno_location();
    if (*piVar4 == 0xc) {
      archive_set_error((archive *)a,0xc,"No memory");
      return L'\xffffffe2';
    }
    archive_mstring_get_wcs(a,(archive_mstring *)((long)client_data + 8),&wcs);
    iVar2 = *piVar4;
    fmt = "Can\'t convert \'%ls\' to MBS";
    pwVar5 = wcs;
  }
LAB_0025927b:
  archive_set_error((archive *)a,iVar2,fmt,pwVar5);
  return L'\xffffffe2';
}

Assistant:

static int
file_open(struct archive *a, void *client_data)
{
	struct write_fd_data *mine;
	struct stat st;

	mine = (struct write_fd_data *)client_data;

	if (fstat(mine->fd, &st) != 0) {
		archive_set_error(a, errno, "Couldn't stat fd %d", mine->fd);
		return (ARCHIVE_FATAL);
	}

	/*
	 * If this is a regular file, don't add it to itself.
	 */
	if (S_ISREG(st.st_mode))
		archive_write_set_skip_file(a, st.st_dev, st.st_ino);

	/*
	 * If client hasn't explicitly set the last block handling,
	 * then set it here.
	 */
	if (archive_write_get_bytes_in_last_block(a) < 0) {
		/* If the output is a block or character device, fifo,
		 * or stdout, pad the last block, otherwise leave it
		 * unpadded. */
		if (S_ISCHR(st.st_mode) || S_ISBLK(st.st_mode) ||
		    S_ISFIFO(st.st_mode) || (mine->fd == 1))
			/* Last block will be fully padded. */
			archive_write_set_bytes_in_last_block(a, 0);
		else
			archive_write_set_bytes_in_last_block(a, 1);
	}

	return (ARCHIVE_OK);
}